

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::CreateSound(CGameContext *this,vec2 Pos,int Sound,int64 Mask)

{
  int *piVar1;
  int64 in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  CNetEvent_SoundWorld *pEvent;
  float local_8;
  float fStack_4;
  
  if ((-1 < in_ESI) &&
     (piVar1 = (int *)CEventHandler::Create((CEventHandler *)(in_RDI + 0x510),0x15,0xc,in_RDX),
     piVar1 != (int *)0x0)) {
    local_8 = (float)in_XMM0_Qa;
    *piVar1 = (int)local_8;
    fStack_4 = (float)((ulong)in_XMM0_Qa >> 0x20);
    piVar1[1] = (int)fStack_4;
    piVar1[2] = in_ESI;
  }
  return;
}

Assistant:

void CGameContext::CreateSound(vec2 Pos, int Sound, int64 Mask)
{
	if (Sound < 0)
		return;

	// create a sound
	CNetEvent_SoundWorld *pEvent = (CNetEvent_SoundWorld *)m_Events.Create(NETEVENTTYPE_SOUNDWORLD, sizeof(CNetEvent_SoundWorld), Mask);
	if(pEvent)
	{
		pEvent->m_X = (int)Pos.x;
		pEvent->m_Y = (int)Pos.y;
		pEvent->m_SoundID = Sound;
	}
}